

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::changeRhsReal(SoPlexBase<double> *this,VectorBase<double> *rhs)

{
  int iVar1;
  int iVar2;
  RangeType *pRVar3;
  SoPlexBase<double> *in_RDI;
  int i;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SoPlexBase<double> *in_stack_ffffffffffffffa0;
  RangeType in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SPxLPRational *this_00;
  VectorBase<double> *in_stack_ffffffffffffffb8;
  undefined1 *puVar4;
  int local_38;
  undefined1 local_28 [40];
  
  _changeRhsReal(in_RDI,in_stack_ffffffffffffffb8);
  iVar1 = intParam(in_RDI,SYNCMODE);
  if (iVar1 == 1) {
    this_00 = in_RDI->_rationalLP;
    puVar4 = local_28;
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase<double>
              ((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)this_00,
               (VectorBase<double> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    (**(code **)((long)&((_Vector_impl_data *)
                        &(this_00->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                         .
                         super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._vptr_ClassArray)->_M_start[6].m_backend.m_value + 0x28))
              (this_00,puVar4,0);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1d8583);
    local_38 = 0;
    while (iVar1 = local_38, iVar2 = numRowsRational((SoPlexBase<double> *)0x1d859d), iVar1 < iVar2)
    {
      in_stack_ffffffffffffffa0 =
           (SoPlexBase<double> *)
           SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           ::lhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::rhs((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      in_stack_ffffffffffffffa8 =
           _rangeTypeRational((SoPlexBase<double> *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                              (Rational *)in_stack_ffffffffffffffa0,
                              (Rational *)
                              CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      pRVar3 = DataArray<soplex::SoPlexBase<double>::RangeType>::operator[]
                         (&in_RDI->_rowTypes,local_38);
      *pRVar3 = in_stack_ffffffffffffffa8;
      local_38 = local_38 + 1;
    }
  }
  _invalidateSolution(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void SoPlexBase<R>::changeRhsReal(const VectorBase<R>& rhs)
{
   assert(_realLP != nullptr);

   _changeRhsReal(rhs);

   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_AUTO)
   {
      _rationalLP->changeRhs(VectorRational(rhs));

      for(int i = 0; i < numRowsRational(); i++)
         _rowTypes[i] = _rangeTypeRational(_rationalLP->lhs(i), _rationalLP->rhs(i));
   }

   _invalidateSolution();
}